

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O3

void elem_float(t_elem *x,t_float f)

{
  t_gpointer *gp;
  char cVar1;
  t_symbol *ptVar2;
  _scalar *p_Var3;
  _array *array;
  int iVar4;
  t_symbol *s;
  t_symbol *ptVar5;
  t_template *ptVar6;
  int iVar7;
  char *pcVar8;
  char *fmt;
  long lVar9;
  bool bVar10;
  int type;
  int onset;
  t_symbol *elemtemplatesym;
  int local_38;
  int local_34;
  t_symbol *local_30;
  
  ptVar5 = x->x_fieldsym;
  gp = &x->x_gparent;
  iVar4 = gpointer_check(gp,0);
  if (iVar4 == 0) {
    pd_error(x,"element: empty pointer");
    return;
  }
  ptVar2 = x->x_templatesym;
  cVar1 = *ptVar2->s_name;
  s = gpointer_gettemplatesym(gp);
  if ((cVar1 != '\0') && (bVar10 = ptVar2 != s, s = ptVar2, bVar10)) {
    pcVar8 = ptVar2->s_name;
    ptVar5 = gpointer_gettemplatesym(gp);
    pd_error(x,"element %s: got wrong template (%s)",pcVar8,ptVar5->s_name);
    return;
  }
  ptVar6 = template_findbyname(s);
  if (ptVar6 == (t_template *)0x0) {
    pd_error(x,"element: couldn\'t find template %s",s->s_name);
    return;
  }
  lVar9 = 0x18;
  if (((x->x_gparent).gp_stub)->gs_which == 2) {
    lVar9 = 0;
  }
  p_Var3 = (x->x_gparent).gp_un.gp_scalar;
  iVar4 = template_find_field(ptVar6,ptVar5,&local_34,&local_38,&local_30);
  if (iVar4 == 0) {
    pcVar8 = ptVar5->s_name;
    fmt = "element: couldn\'t find array field %s";
  }
  else if (local_38 == 3) {
    ptVar6 = template_findbyname(local_30);
    if (ptVar6 != (t_template *)0x0) {
      array = *(_array **)((long)p_Var3->sc_vec + local_34 + lVar9 + -0x18);
      iVar4 = 0;
      if (0 < (int)f) {
        iVar4 = (int)f;
      }
      iVar7 = array->a_n + -1;
      if (iVar4 < array->a_n) {
        iVar7 = iVar4;
      }
      gpointer_setarray(&x->x_gp,array,(t_word *)(array->a_vec + iVar7 * ptVar6->t_n * 8));
      outlet_pointer((x->x_obj).te_outlet,&x->x_gp);
      return;
    }
    pcVar8 = local_30->s_name;
    fmt = "element: couldn\'t find field template %s";
  }
  else {
    pcVar8 = ptVar5->s_name;
    fmt = "element: field %s not of type array";
  }
  pd_error(x,fmt,pcVar8);
  return;
}

Assistant:

static void elem_float(t_elem *x, t_float f)
{
    int indx = f, nitems, onset;
    t_symbol *templatesym, *fieldsym = x->x_fieldsym, *elemtemplatesym;
    t_template *template;
    t_template *elemtemplate;
    t_gpointer *gparent = &x->x_gparent;
    t_word *w;
    t_array *array;
    int elemsize, type;

    if (!gpointer_check(gparent, 0))
    {
        pd_error(x, "element: empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) !=
            gpointer_gettemplatesym(gparent))
        {
            pd_error(x, "element %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gparent)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gparent);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "element: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (gparent->gp_stub->gs_which == GP_ARRAY) w = gparent->gp_un.gp_w;
    else w = gparent->gp_un.gp_scalar->sc_vec;
    if (!template)
    {
        pd_error(x, "element: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (!template_find_field(template, fieldsym,
        &onset, &type, &elemtemplatesym))
    {
        pd_error(x, "element: couldn't find array field %s", fieldsym->s_name);
        return;
    }
    if (type != DT_ARRAY)
    {
        pd_error(x, "element: field %s not of type array", fieldsym->s_name);
        return;
    }
    if (!(elemtemplate = template_findbyname(elemtemplatesym)))
    {
        pd_error(x, "element: couldn't find field template %s",
            elemtemplatesym->s_name);
        return;
    }

    elemsize = elemtemplate->t_n * sizeof(t_word);

    array = *(t_array **)(((char *)w) + onset);

    nitems = array->a_n;
    if (indx < 0) indx = 0;
    if (indx >= nitems) indx = nitems-1;

    gpointer_setarray(&x->x_gp, array,
        (t_word *)((char *)(array->a_vec) + indx * elemsize));
    outlet_pointer(x->x_obj.ob_outlet, &x->x_gp);
}